

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

pcut_item_t * pcut_get_real(pcut_item_t *item)

{
  if (item != (pcut_item_t *)0x0) {
    do {
      if (item->kind != 0) {
        return item;
      }
      item = item->next;
    } while (item != (pcut_item_t *)0x0);
  }
  return (pcut_item_t *)0x0;
}

Assistant:

pcut_item_t *pcut_get_real(pcut_item_t *item) {
	if (item == NULL) {
		return NULL;
	}

	if (item->kind == PCUT_KIND_SKIP) {
		return pcut_get_real_next(item);
	} else {
		return item;
	}
}